

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url_dispatcher.cpp
# Opt level: O1

void __thiscall
cppcms::url_dispatcher::map_generic
          (url_dispatcher *this,string *method,regex *re,generic_handler *h)

{
  pointer pcVar1;
  generic_option *__p;
  long lVar2;
  shared_ptr<cppcms::(anonymous_namespace)::option> opt;
  undefined1 *local_60;
  long local_58;
  undefined1 local_50 [16];
  shared_ptr<cppcms::(anonymous_namespace)::option> local_40;
  
  __p = (generic_option *)operator_new(0x88);
  local_60 = local_50;
  pcVar1 = (method->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar1,pcVar1 + method->_M_string_length);
  (__p->super_option)._vptr_option = (_func_int **)&PTR__option_00288cf0;
  booster::regex::regex(&(__p->super_option).expr_,re);
  (__p->super_option).match_.offsets_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__p->super_option).match_.offsets_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__p->super_option).match_.begin_ = (char *)0x0;
  (__p->super_option).match_.end_ = (char *)0x0;
  (__p->super_option).match_.offsets_.
  super__Vector_base<std::pair<int,_int>,_std::allocator<std::pair<int,_int>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__p->super_option).match_method_ = 1;
  booster::regex::regex(&(__p->super_option).mexpr_,(string *)&local_60,0);
  (__p->super_option).method_._M_dataplus._M_p = (pointer)&(__p->super_option).method_.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&(__p->super_option).method_,local_60,local_60 + local_58);
  if (local_58 != 0) {
    lVar2 = 0;
    do {
      if (0x19 < (byte)(local_60[lVar2] + 0xbf)) {
        (__p->super_option).match_method_ = 2;
        break;
      }
      lVar2 = lVar2 + 1;
    } while (local_58 != lVar2);
  }
  (__p->super_option)._vptr_option = (_func_int **)&PTR__generic_option_00288d18;
  std::function<bool_(cppcms::application_&,_const_booster::match_results<const_char_*>_&)>::
  function(&__p->handle_,h);
  std::shared_ptr<cppcms::(anonymous_namespace)::option>::
  shared_ptr<cppcms::(anonymous_namespace)::generic_option,void>(&local_40,__p);
  if (local_60 != local_50) {
    operator_delete(local_60);
  }
  std::
  vector<std::shared_ptr<cppcms::(anonymous_namespace)::option>,_std::allocator<std::shared_ptr<cppcms::(anonymous_namespace)::option>_>_>
  ::push_back(&((this->d).ptr_)->options,&local_40);
  if (local_40.super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.
               super___shared_ptr<cppcms::(anonymous_namespace)::option,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  return;
}

Assistant:

void url_dispatcher::map_generic(std::string const &method,booster::regex const &re,generic_handler const &h)
	{
		booster::shared_ptr<option> opt(new generic_option(method,re,h));
		d->options.push_back(opt);
	}